

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
* __thiscall
enact::cloneAll<enact::Typename_const>
          (vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           *__return_storage_ptr__,enact *this,
          vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          *cloneables)

{
  bool bVar1;
  pointer pTVar2;
  unique_ptr<enact::Typename,_std::default_delete<enact::Typename>_> local_50;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> local_48;
  reference local_40;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *cloneable;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *__range2;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *cloneables_local;
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  *cloned;
  
  std::
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ::vector(__return_storage_ptr__);
  __end0 = std::
           vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ::begin((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                    *)this);
  cloneable = (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
              std::
              vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
              ::end((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                     *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_*,_std::vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>_>
                                     *)&cloneable), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_*,_std::vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>_>
               ::operator*(&__end0);
    pTVar2 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
             operator->(local_40);
    (*pTVar2->_vptr_Typename[2])(&local_50);
    std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::
    unique_ptr<enact::Typename,std::default_delete<enact::Typename>,void>
              ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *)
               &local_48,&local_50);
    std::
    vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_48);
    std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
              (&local_48);
    std::unique_ptr<enact::Typename,_std::default_delete<enact::Typename>_>::~unique_ptr(&local_50);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_*,_std::vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::unique_ptr<Cloneable>> cloneAll(const std::vector<std::unique_ptr<Cloneable>>& cloneables) {
        std::vector<std::unique_ptr<Cloneable>> cloned;
        for (const std::unique_ptr<Cloneable>& cloneable : cloneables) {
            cloned.push_back(cloneable->clone());
        }
        return cloned;
    }